

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveOneofFieldGenerator::GenerateBuilderMembers
          (ImmutablePrimitiveOneofFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  LogMessage *other;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  Printer *local_18;
  Printer *printer_local;
  ImmutablePrimitiveOneofFieldGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  bVar1 = HasHazzer((this->super_ImmutablePrimitiveFieldGenerator).descriptor_);
  local_51 = 0;
  if (!bVar1) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_primitive_field.cc"
               ,0x23b);
    local_51 = 1;
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: HasHazzer(descriptor_): ");
    internal::LogFinisher::operator=(local_65,other);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  WriteFieldAccessorDocComment
            (local_18,(this->super_ImmutablePrimitiveFieldGenerator).descriptor_,HAZZER,false);
  io::Printer::Print(local_18,&(this->super_ImmutablePrimitiveFieldGenerator).variables_,
                     "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n  return $has_oneof_case_message$;\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (local_18,"{","}",(this->super_ImmutablePrimitiveFieldGenerator).descriptor_);
  WriteFieldAccessorDocComment
            (local_18,(this->super_ImmutablePrimitiveFieldGenerator).descriptor_,GETTER,false);
  io::Printer::Print(local_18,&(this->super_ImmutablePrimitiveFieldGenerator).variables_,
                     "$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n  if ($has_oneof_case_message$) {\n    return ($boxed_type$) $oneof_name$_;\n  }\n  return $default$;\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (local_18,"{","}",(this->super_ImmutablePrimitiveFieldGenerator).descriptor_);
  WriteFieldAccessorDocComment
            (local_18,(this->super_ImmutablePrimitiveFieldGenerator).descriptor_,SETTER,true);
  io::Printer::Print(local_18,&(this->super_ImmutablePrimitiveFieldGenerator).variables_,
                     "$deprecation$public Builder ${$set$capitalized_name$$}$($type$ value) {\n$null_check$  $set_oneof_case_message$;\n  $oneof_name$_ = value;\n  $on_changed$\n  return this;\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (local_18,"{","}",(this->super_ImmutablePrimitiveFieldGenerator).descriptor_);
  WriteFieldAccessorDocComment
            (local_18,(this->super_ImmutablePrimitiveFieldGenerator).descriptor_,CLEARER,true);
  io::Printer::Print(local_18,&(this->super_ImmutablePrimitiveFieldGenerator).variables_,
                     "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n  if ($has_oneof_case_message$) {\n    $clear_oneof_case_message$;\n    $oneof_name$_ = null;\n    $on_changed$\n  }\n  return this;\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (local_18,"{","}",(this->super_ImmutablePrimitiveFieldGenerator).descriptor_);
  return;
}

Assistant:

void ImmutablePrimitiveOneofFieldGenerator::GenerateBuilderMembers(
    io::Printer* printer) const {
  GOOGLE_DCHECK(HasHazzer(descriptor_));
  WriteFieldAccessorDocComment(printer, descriptor_, HAZZER);
  printer->Print(variables_,
                 "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n"
                 "  return $has_oneof_case_message$;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldAccessorDocComment(printer, descriptor_, GETTER);
  printer->Print(variables_,
                 "$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n"
                 "  if ($has_oneof_case_message$) {\n"
                 "    return ($boxed_type$) $oneof_name$_;\n"
                 "  }\n"
                 "  return $default$;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldAccessorDocComment(printer, descriptor_, SETTER,
                               /* builder */ true);
  printer->Print(variables_,
                 "$deprecation$public Builder "
                 "${$set$capitalized_name$$}$($type$ value) {\n"
                 "$null_check$"
                 "  $set_oneof_case_message$;\n"
                 "  $oneof_name$_ = value;\n"
                 "  $on_changed$\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER,
                               /* builder */ true);
  printer->Print(
      variables_,
      "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n"
      "  if ($has_oneof_case_message$) {\n"
      "    $clear_oneof_case_message$;\n"
      "    $oneof_name$_ = null;\n"
      "    $on_changed$\n"
      "  }\n"
      "  return this;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
}